

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldUpgradeList
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  bool bVar1;
  char (*params_1) [7];
  bool local_269;
  ArrayPtr<const_char> local_258 [2];
  String local_238;
  ArrayPtr<const_char> local_220;
  ArrayPtr<const_char> local_210;
  StringPtr local_200;
  ArrayPtr<const_char> local_1f0;
  StringPtr local_1e0;
  StringPtr local_1d0;
  Reader local_1c0;
  undefined1 local_190 [8];
  Reader nameText;
  Builder relativeName;
  undefined1 local_130 [8];
  Builder elementType;
  undefined1 local_e0 [8];
  Builder typeParams;
  undefined1 local_a8 [8];
  Builder type;
  Builder local_70;
  undefined1 local_48 [8];
  Builder field;
  bool scopeHasUnion_local;
  uint *nextOrdinal_local;
  
  field._builder._39_1_ = scopeHasUnion;
  Declaration::Builder::getField((Builder *)local_48,&decl);
  Declaration::Field::Builder::getDefaultValue(&local_70,(Builder *)local_48);
  bVar1 = Declaration::Field::DefaultValue::Builder::isValue(&local_70);
  if (bVar1) {
    kj::StringPtr::StringPtr
              ((StringPtr *)&type._builder.dataSize,
               "Upgrade primitive list to struct list, but it had a default value.");
    ChangeInfo::ChangeInfo(__return_storage_ptr__,NO_CHANGE,(StringPtr)stack0xffffffffffffff80);
  }
  else {
    Declaration::Field::Builder::getType((Builder *)local_a8,(Builder *)local_48);
    bVar1 = Expression::Builder::isApplication((Builder *)local_a8);
    if (bVar1) {
      Expression::Builder::getApplication
                ((Builder *)&elementType._builder.dataSize,(Builder *)local_a8);
      Expression::Application::Builder::getParams
                ((Builder *)local_e0,(Builder *)&elementType._builder.dataSize);
      List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)&relativeName._builder.dataSize,(Builder *)local_e0,0);
      Expression::Param::Builder::getValue
                ((Builder *)local_130,(Builder *)&relativeName._builder.dataSize);
      Expression::Builder::getRelativeName
                ((Builder *)&nameText.super_StringPtr.content.size_,(Builder *)local_130);
      LocatedText::Builder::asReader(&local_1c0,(Builder *)&nameText.super_StringPtr.content.size_);
      _local_190 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_1c0);
      kj::StringPtr::StringPtr(&local_1d0,"StructType");
      bVar1 = kj::StringPtr::operator==((StringPtr *)local_190,&local_1d0);
      params_1 = (char (*) [7])CONCAT71((int7)((ulong)nextOrdinal >> 8),bVar1);
      local_269 = true;
      if (!bVar1) {
        kj::StringPtr::StringPtr(&local_1e0,"Struct");
        local_269 = kj::StringPtr::endsWith((StringPtr *)local_190,&local_1e0);
      }
      if (local_269 == false) {
        kj::StringPtr::StringPtr(&local_200,"Bool");
        bVar1 = kj::StringPtr::operator==((StringPtr *)local_190,&local_200);
        if (bVar1) {
          kj::StringPtr::StringPtr
                    ((StringPtr *)&local_210,
                     "Upgrade primitive list to struct list, but bool lists can\'t be upgraded.");
          ChangeInfo::ChangeInfo(__return_storage_ptr__,NO_CHANGE,(StringPtr)local_210);
        }
        else {
          kj::str<capnp::Text::Reader&,char_const(&)[7]>
                    (&local_238,(kj *)local_190,(Reader *)0x31eb7d,params_1);
          Text::Reader::Reader((Reader *)&local_220,&local_238);
          LocatedText::Builder::setValue
                    ((Builder *)&nameText.super_StringPtr.content.size_,(Reader)local_220);
          kj::String::~String(&local_238);
          kj::StringPtr::StringPtr((StringPtr *)local_258,"Upgrade primitive list to struct list");
          ChangeInfo::ChangeInfo(__return_storage_ptr__,COMPATIBLE,(StringPtr)local_258[0]);
        }
      }
      else {
        kj::StringPtr::StringPtr
                  ((StringPtr *)&local_1f0,
                   "Upgrade primitive list to struct list, but it was already a struct list.");
        ChangeInfo::ChangeInfo(__return_storage_ptr__,NO_CHANGE,(StringPtr)local_1f0);
      }
    }
    else {
      kj::StringPtr::StringPtr
                ((StringPtr *)&typeParams.builder.structDataSize,
                 "Upgrade primitive list to struct list, but it wasn\'t a list.");
      ChangeInfo::ChangeInfo(__return_storage_ptr__,NO_CHANGE,(StringPtr)stack0xffffffffffffff48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldUpgradeList(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  // Upgrades a non-struct list to a struct list.

  auto field = decl.getField();
  if (field.getDefaultValue().isValue()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it had a default value." };
  }

  auto type = field.getType();
  if (!type.isApplication()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it wasn't a list." };
  }
  auto typeParams = type.getApplication().getParams();

  auto elementType = typeParams[0].getValue();
  auto relativeName = elementType.getRelativeName();
  auto nameText = relativeName.asReader().getValue();
  if (nameText == "StructType" || nameText.endsWith("Struct")) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it was already a struct list."};
  }
  if (nameText == "Bool") {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but bool lists can't be upgraded."};
  }

  relativeName.setValue(kj::str(nameText, "Struct"));
  return { COMPATIBLE, "Upgrade primitive list to struct list" };
}